

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

double CWire::GetSegmentListCost(vector<CSegment_*,_std::allocator<CSegment_*>_> *pSegmentList)

{
  int iVar1;
  CDesign *pCVar2;
  size_type sVar3;
  reference ppCVar4;
  int local_30;
  int local_28;
  int local_1c;
  int s;
  int i;
  int iMinZ;
  int iMaxZ;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pSegmentList_local;
  
  if (pSegmentList != (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0) {
    i = 1;
    pCVar2 = CObject::GetDesign();
    s = CBBox::T(&pCVar2->super_CBBox);
    local_1c = 0;
    sVar3 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::size(pSegmentList);
    for (; local_1c < (int)sVar3; local_1c = local_1c + 1) {
      ppCVar4 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::at
                          (pSegmentList,(long)local_1c);
      iVar1 = CPoint::Z((*ppCVar4)->m_pPointE);
      if (iVar1 < i) {
        local_28 = i;
      }
      else {
        ppCVar4 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::at
                            (pSegmentList,(long)local_1c);
        local_28 = CPoint::Z((*ppCVar4)->m_pPointE);
      }
      i = local_28;
      ppCVar4 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::at
                          (pSegmentList,(long)local_1c);
      iVar1 = CPoint::Z((*ppCVar4)->m_pPointE);
      if (s < iVar1) {
        local_30 = s;
      }
      else {
        ppCVar4 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::at
                            (pSegmentList,(long)local_1c);
        local_30 = CPoint::Z((*ppCVar4)->m_pPointE);
      }
      s = local_30;
    }
    return (double)((i - s) + 1);
  }
  __assert_fail("pSegmentList",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                ,0x275,"static double CWire::GetSegmentListCost(vector<CSegment *> *)");
}

Assistant:

double CWire::GetSegmentListCost(vector<CSegment*>* pSegmentList)
{
	assert(pSegmentList);

	// via cost [2/10/2007 thyeros]
	int	iMaxZ	=	LAYER_METAL1;
	int	iMinZ	=	GetDesign()->T();

	for(int i=0,s=pSegmentList->size();i<s;++i)
	{
		iMaxZ	=	MAX(iMaxZ,pSegmentList->at(i)->m_pPointE->Z());
		iMinZ	=	MIN(iMinZ,pSegmentList->at(i)->m_pPointE->Z());
	}

	return	iMaxZ-iMinZ+1;
}